

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O0

void __thiscall
t_netstd_generator::generate_service_interface
          (t_netstd_generator *this,ostream *out,t_service *tservice)

{
  t_function *ptVar1;
  bool bVar2;
  t_service *ptVar3;
  ostream *poVar4;
  vector<t_function_*,_std::allocator<t_function_*>_> *__x;
  reference pptVar5;
  t_struct *this_00;
  reference pptVar6;
  t_type *ttype;
  long lVar7;
  pointer ppVar8;
  string local_330;
  allocator local_309;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  _Self local_268;
  allocator local_259;
  key_type local_258;
  _Self local_238;
  iterator iter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string local_1d0;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_1b0
  ;
  t_field **local_1a8;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_1a0
  ;
  const_iterator x_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *xceptions;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_170;
  t_function **local_168;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_160;
  iterator f_iter;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string local_120;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  allocator local_79;
  string local_78 [8];
  string extends_iface;
  allocator local_41;
  undefined1 local_40 [8];
  string extends;
  t_service *tservice_local;
  ostream *out_local;
  t_netstd_generator *this_local;
  
  extends.field_2._8_8_ = tservice;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_40,"",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"",&local_79);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  ptVar3 = t_service::get_extends((t_service *)extends.field_2._8_8_);
  if (ptVar3 != (t_service *)0x0) {
    ptVar3 = t_service::get_extends((t_service *)extends.field_2._8_8_);
    type_name_abi_cxx11_(&local_a0,this,&ptVar3->super_t_type,true);
    std::__cxx11::string::operator=((string *)local_40,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::operator+(&local_e0," : ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    std::operator+(&local_c0,&local_e0,".IAsync");
    std::__cxx11::string::operator=(local_78,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  generate_netstd_doc(this,out,(t_doc *)extends.field_2._8_8_);
  bVar2 = is_wcf_enabled(this);
  if (bVar2) {
    t_generator::indent_abi_cxx11_(&local_100,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_100);
    poVar4 = std::operator<<(poVar4,"[ServiceContract(Namespace=\"");
    poVar4 = std::operator<<(poVar4,(string *)&this->wcf_namespace_);
    poVar4 = std::operator<<(poVar4,"\")]");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_100);
  }
  prepare_member_name_mapping(this,(t_service *)extends.field_2._8_8_);
  t_generator::indent_abi_cxx11_(&local_120,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_120);
  poVar4 = std::operator<<(poVar4,"public interface IAsync");
  poVar4 = std::operator<<(poVar4,local_78);
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_
            ((string *)
             &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)
                                  &functions.
                                   super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage);
  poVar4 = std::operator<<(poVar4,"{");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string
            ((string *)
             &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&local_120);
  t_generator::indent_up((t_generator *)this);
  __x = t_service::get_functions((t_service *)extends.field_2._8_8_);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter,__x);
  __gnu_cxx::
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
  __normal_iterator(&local_160);
  local_168 = (t_function **)
              std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                        ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  local_160._M_current = local_168;
  while( true ) {
    local_170._M_current =
         (t_function **)
         std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
    bVar2 = __gnu_cxx::operator!=(&local_160,&local_170);
    if (!bVar2) break;
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_160);
    generate_netstd_doc(this,out,*pptVar5);
    bVar2 = is_wcf_enabled(this);
    if (bVar2) {
      t_generator::indent_abi_cxx11_((string *)&xceptions,(t_generator *)this);
      poVar4 = std::operator<<(out,(string *)&xceptions);
      poVar4 = std::operator<<(poVar4,"[OperationContract]");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&xceptions);
      pptVar5 = __gnu_cxx::
                __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_160);
      this_00 = t_function::get_xceptions(*pptVar5);
      x_iter._M_current = (t_field **)t_struct::get_members(this_00);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      __normal_iterator(&local_1a0);
      local_1a8 = (t_field **)
                  std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(x_iter._M_current);
      local_1a0._M_current = local_1a8;
      while( true ) {
        local_1b0._M_current =
             (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(x_iter._M_current);
        bVar2 = __gnu_cxx::operator!=(&local_1a0,&local_1b0);
        if (!bVar2) break;
        t_generator::indent_abi_cxx11_(&local_1d0,(t_generator *)this);
        poVar4 = std::operator<<(out,(string *)&local_1d0);
        pptVar6 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_1a0);
        ttype = t_field::get_type(*pptVar6);
        type_name_abi_cxx11_((string *)&iter,this,ttype,true);
        std::operator+(&local_210,"[FaultContract(typeof(",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&iter);
        std::operator+(&local_1f0,&local_210,"Fault))]");
        poVar4 = std::operator<<(poVar4,(string *)&local_1f0);
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::string::~string((string *)&iter);
        std::__cxx11::string::~string((string *)&local_1d0);
        __gnu_cxx::
        __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
        operator++(&local_1a0);
      }
    }
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_160);
    ptVar1 = *pptVar5;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_258,"deprecated",&local_259);
    local_238._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(&ptVar1->annotations_,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::allocator<char>::~allocator((allocator<char> *)&local_259);
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_160);
    local_268._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&(*pptVar5)->annotations_);
    bVar2 = std::operator!=(&local_268,&local_238);
    if (bVar2) {
      t_generator::indent_abi_cxx11_(&local_288,(t_generator *)this);
      poVar4 = std::operator<<(out,(string *)&local_288);
      std::operator<<(poVar4,"[Obsolete");
      std::__cxx11::string::~string((string *)&local_288);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator->(&local_238);
      lVar7 = std::__cxx11::string::length();
      if (lVar7 != 0) {
        ppVar8 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator->(&local_238);
        bVar2 = std::operator!=(&ppVar8->second,"1");
        if (bVar2) {
          poVar4 = std::operator<<(out,"(");
          ppVar8 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator->(&local_238);
          make_csharp_string_literal(&local_2a8,this,&ppVar8->second);
          poVar4 = std::operator<<(poVar4,(string *)&local_2a8);
          std::operator<<(poVar4,")");
          std::__cxx11::string::~string((string *)&local_2a8);
        }
      }
      poVar4 = std::operator<<(out,"]");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    }
    t_generator::indent_abi_cxx11_(&local_2c8,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_2c8);
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_160);
    ptVar1 = *pptVar5;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_308,"",&local_309);
    function_signature_async(&local_2e8,this,ptVar1,&local_308,0);
    poVar4 = std::operator<<(poVar4,(string *)&local_2e8);
    poVar4 = std::operator<<(poVar4,";");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_308);
    std::allocator<char>::~allocator((allocator<char> *)&local_309);
    std::__cxx11::string::~string((string *)&local_2c8);
    __gnu_cxx::
    __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
    operator++(&local_160);
  }
  t_generator::indent_down((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_330,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_330);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_330);
  cleanup_member_name_mapping(this,(void *)extends.field_2._8_8_);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::~vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void t_netstd_generator::generate_service_interface(ostream& out, t_service* tservice)
{
    string extends = "";
    string extends_iface = "";
    if (tservice->get_extends() != nullptr)
    {
        extends = type_name(tservice->get_extends());
        extends_iface = " : " + extends + ".IAsync";
    }

    //out << endl << endl;

    generate_netstd_doc(out, tservice);

    if (is_wcf_enabled())
    {
        out << indent() << "[ServiceContract(Namespace=\"" << wcf_namespace_ << "\")]" << endl;
    }

    prepare_member_name_mapping(tservice);
    out << indent() << "public interface IAsync" << extends_iface << endl
        << indent() << "{" << endl;

    indent_up();
    vector<t_function*> functions = tservice->get_functions();
    vector<t_function*>::iterator f_iter;
    for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter)
    {
        generate_netstd_doc(out, *f_iter);

        // if we're using WCF, add the corresponding attributes
        if (is_wcf_enabled())
        {
            out << indent() << "[OperationContract]" << endl;

            const vector<t_field*>& xceptions = (*f_iter)->get_xceptions()->get_members();
            vector<t_field*>::const_iterator x_iter;
            for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter)
            {
                out << indent() << "[FaultContract(typeof(" + type_name((*x_iter)->get_type()) + "Fault))]" << endl;
            }
        }

        auto iter = (*f_iter)->annotations_.find("deprecated");
        if( (*f_iter)->annotations_.end() != iter) {
          out << indent() << "[Obsolete";
          // empty annotation values end up with "1" somewhere, ignore these as well
          if ((iter->second.length() > 0) && (iter->second != "1")) {
            out << "(" << make_csharp_string_literal(iter->second) << ")";
          }
          out << "]" << endl;
        }

        out << indent() << function_signature_async(*f_iter) << ";" << endl << endl;
    }
    indent_down();
    out << indent() << "}" << endl << endl;
    cleanup_member_name_mapping(tservice);
}